

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

MIR_item_t_conflict
MIR_new_vararg_proto
          (MIR_context_t ctx,char *name,size_t nres,MIR_type_t *res_types,size_t nargs,...)

{
  char in_AL;
  MIR_item_t_conflict pMVar1;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list argp;
  __va_list_tag local_d8;
  undefined1 local_b8 [40];
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  local_d8.reg_save_area = local_b8;
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  local_d8.overflow_arg_area = &stack0x00000008;
  local_d8.gp_offset = 0x28;
  local_d8.fp_offset = 0x30;
  local_90 = in_R9;
  pMVar1 = new_proto(ctx,name,nres,res_types,nargs,1,&local_d8);
  return pMVar1;
}

Assistant:

MIR_item_t MIR_new_vararg_proto (MIR_context_t ctx, const char *name, size_t nres,
                                 MIR_type_t *res_types, size_t nargs, ...) {
  va_list argp;
  MIR_item_t proto_item;

  va_start (argp, nargs);
  proto_item = new_proto (ctx, name, nres, res_types, nargs, TRUE, argp);
  va_end (argp);
  return proto_item;
}